

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
          (void *this,Symbol *a,FullNameQuery *b)

{
  bool bVar1;
  int iVar2;
  SymbolBase *__n;
  string_view sVar3;
  
  sVar3 = Symbol::full_name((Symbol *)this);
  __n = (SymbolBase *)sVar3._M_len;
  if (__n == a->ptr_) {
    if (__n != (SymbolBase *)0x0) {
      iVar2 = bcmp(sVar3._M_str,a[1].ptr_,(size_t)__n);
      if (iVar2 != 0) goto LAB_00172ca8;
    }
    bVar1 = true;
  }
  else {
LAB_00172ca8:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.full_name() == b.full_name();
  }